

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

bool __thiscall QWizard::event(QWizard *this,QEvent *event)

{
  QWizardPrivate *this_00;
  bool bVar1;
  QStyle *style;
  
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(short *)(event + 8) == 0x27) {
    QWizardPrivate::updatePalette(this_00);
  }
  else if (*(short *)(event + 8) == 100) {
    style = QWidget::style((QWidget *)this);
    QWizardPrivate::setStyle(this_00,style);
    QWizardPrivate::updateLayout(this_00);
  }
  bVar1 = QWidget::event((QWidget *)this,event);
  return bVar1;
}

Assistant:

bool QWizard::event(QEvent *event)
{
    Q_D(QWizard);
    if (event->type() == QEvent::StyleChange) { // Propagate style
        d->setStyle(style());
        d->updateLayout();
    } else if (event->type() == QEvent::PaletteChange) { // Emitted on theme change
        d->updatePalette();
    }
#if QT_CONFIG(style_windowsvista)
    else if (event->type() == QEvent::Show && d->vistaInitPending) {
        d->vistaInitPending = false;
        d->wizStyle = AeroStyle;
        d->handleAeroStyleChange();
    }
    else if (d->isVistaThemeEnabled()) {
        if (event->type() == QEvent::Resize
                || event->type() == QEvent::LayoutDirectionChange) {
            const int buttonLeft = (layoutDirection() == Qt::RightToLeft
                                    ? width() - d->vistaHelper->backButton()->sizeHint().width()
                                    : 0);

            d->vistaHelper->backButton()->move(buttonLeft,
                                               d->vistaHelper->backButton()->y());
        }

        d->vistaHelper->mouseEvent(event);
    }
#endif
    return QDialog::event(event);
}